

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void IOCall(item *x,item *y)

{
  int iVar1;
  typeDesc *ptVar2;
  int local_24;
  int r;
  typeDesc *type;
  item *y_local;
  item *x_local;
  
  ptVar2 = getType(y->typeIndex);
  if (x->a == 0) {
    if (ptVar2->index != charTypeIndex) {
      mark("not a char in writeChar");
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    put(0x37,0,0,y->r);
    regs[y->r] = 0;
  }
  else if (x->a == 1) {
    if (ptVar2->index != intTypeIndex) {
      mark("not an int in writeInt");
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    put(0x38,0,0,y->r);
    regs[y->r] = 0;
  }
  else if (x->a == 2) {
    put(0x32,0x1c,0,4);
    local_24 = getReg();
    if (ptVar2->form == 0x327) {
      put(0x39,local_24,y->r,y->a);
    }
    else {
      if (ptVar2->form != 0x322) {
        mark("bad type in fopen");
        exit(-1);
      }
      if (y->hs == 0) {
        put(0x3a,local_24,y->r,y->a);
      }
      else {
        local_24 = getReg();
        put(0x28,y->hs,0,3);
        put(0x3a,local_24,y->r,y->a);
        put(0x28,0,0,2);
        put(0x39,local_24,y->r,y->a);
        regs[x->hs] = 0;
      }
    }
    put(0x34,local_24,0x1c,0);
    regs[y->r] = 0;
    regs[local_24] = 0;
  }
  else if (x->a == 3) {
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) {
      mark("not a file type in fclose");
      exit(-1);
    }
    iVar1 = getReg();
    put(0x20,iVar1,y->r,y->a);
    put(0x33,iVar1,iVar1,0);
    put(0x3b,0x1c,0,iVar1);
    regs[iVar1] = 0;
  }
  else if (x->a == 4) {
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) {
      mark("not a file type in feof");
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x33,iVar1,iVar1,0);
    put(0x3c,0x1c,0,iVar1);
    regs[iVar1] = 0;
  }
  else if (x->a == 5) {
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) {
      mark("not a file type in feof");
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x33,iVar1,iVar1,0);
    put(0x3d,0x1c,0,iVar1);
    regs[iVar1] = 0;
  }
  else if (x->a == 6) {
    if (ptVar2->index != charTypeIndex) {
      mark("ord only for char");
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x35,0x1c,0,iVar1);
    y->typeIndex = intTypeIndex;
    regs[iVar1] = 0;
  }
  return;
}

Assistant:

procedure 
void IOCall(struct item *x, struct item *y) {
	variable struct typeDesc *type;
	variable int r; r = 0;
	type = getType(y->typeIndex);
	/* writeChar */
	if (x->a == 0) {
		if (type->index != charTypeIndex) {
			mark("not a char in writeChar");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRC,0,0,y->r);
		regs[y->r] = 0;

	/* writeInt */
	} elsif (x->a == 1) {
		if (type->index != intTypeIndex) {
			mark("not an int in writeInt");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRI,0,0,y->r);
		regs[y->r]=0;

	/* handle fopen */
	} elsif (x->a == 2) {
		put(RISC_ALL,rv,0,wordSize); 
		r = getReg();

		/* if form is string literal, then addy is on heap */
		if (type->form == FORM_STRLIT) {
			put(RISC_HFOPEN,r,y->r,y->a);
		} elsif (type->form == FORM_ARRAY) {
			if (y->hs != 0) {
				r = getReg();
				put(RISC_BEQ,y->hs,0,3); 
				put(RISC_SFOPEN,r,y->r,y->a);
				put(RISC_BEQ,0,0,2);
				put(RISC_HFOPEN,r,y->r,y->a);
				regs[x->hs] = 0;
			} else {
				put(RISC_SFOPEN,r,y->r,y->a);
			}
		} else {
			mark("bad type in fopen");
			exit(-1);
		}
		put(RISC_HSTW,r,rv,0);
		regs[y->r] = 0;
		regs[r] = 0;

	/* handle fclose */
	} elsif (x->a == 3) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in fclose");
			exit(-1);

		/* load fd in register and close (fd is on heap) */
		} else {
			r = getReg();
			put(RISC_LDW,r,y->r,y->a);
			put(RISC_HLDW,r,r,0);
			put(RISC_FCLOSE,rv,0,r);
			regs[r] = 0;
		}
	
	/* handle feof */
	} elsif (x->a == 4) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FEOF,rv,0,r);
			regs[r] = 0;
		}

	/* handle fgetc */
	} elsif (x->a == 5) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FGETC,rv,0,r);
			regs[r] = 0;
		}
	} elsif (x->a == 6) {
		if (type->index != charTypeIndex) {
			mark("ord only for char");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_ORD,rv,0,r);
			y->typeIndex = intTypeIndex;
			regs[r] = 0;
		}
	}
}